

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_buildSeqStore(ZSTD_CCtx *zc,void *src,size_t srcSize)

{
  undefined4 uVar1;
  BYTE *pBVar2;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  uint uVar13;
  ZSTD_dictMode_e dictMode_00;
  ZSTD_matchState_t *ms_00;
  size_t code;
  ZSTD_blockCompressor p_Var14;
  bool bVar15;
  undefined4 in_stack_fffffffffffffef4;
  undefined8 in_stack_ffffffffffffff14;
  int local_dc;
  BYTE *lastLiterals;
  ZSTD_blockCompressor blockCompressor;
  size_t err_code;
  rawSeqStore_t ldmSeqStore;
  size_t sStack_90;
  int i;
  size_t lastLLSize;
  ZSTD_dictMode_e dictMode;
  U32 current;
  BYTE *istart;
  BYTE *base;
  ZSTD_matchState_t *ms;
  size_t srcSize_local;
  void *src_local;
  ZSTD_CCtx *zc_local;
  
  ms_00 = &(zc->blockState).matchState;
  if (0x20000 < srcSize) {
    __assert_fail("srcSize <= ZSTD_BLOCKSIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3307,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  uVar3 = (zc->appliedParams).cParams.hashLog;
  uVar4 = (zc->appliedParams).cParams.searchLog;
  uVar5 = (zc->appliedParams).cParams.minMatch;
  uVar6 = (zc->appliedParams).cParams.targetLength;
  uVar7 = (zc->appliedParams).cParams.strategy;
  cParams1.minMatch = uVar7;
  cParams1.searchLog = uVar6;
  cParams1.hashLog = uVar5;
  cParams1.chainLog = uVar4;
  cParams1.windowLog = uVar3;
  uVar1 = (zc->blockState).matchState.cParams.windowLog;
  uVar8 = (zc->blockState).matchState.cParams.hashLog;
  uVar9 = (zc->blockState).matchState.cParams.searchLog;
  uVar10 = (zc->blockState).matchState.cParams.minMatch;
  uVar11 = (zc->blockState).matchState.cParams.targetLength;
  uVar12 = (zc->blockState).matchState.cParams.strategy;
  cParams2.minMatch = uVar12;
  cParams2.searchLog = uVar11;
  cParams2.hashLog = uVar10;
  cParams2.chainLog = uVar9;
  cParams2.windowLog = uVar8;
  cParams1.targetLength = in_stack_fffffffffffffef4;
  cParams1.strategy = uVar1;
  cParams2._20_8_ = in_stack_ffffffffffffff14;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  if (srcSize < 7) {
    ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
    zc_local = (ZSTD_CCtx *)0x1;
  }
  else {
    ZSTD_resetSeqStore(&zc->seqStore);
    (zc->blockState).matchState.opt.symbolCosts = &((zc->blockState).prevCBlock)->entropy;
    (zc->blockState).matchState.opt.literalCompressionMode =
         (zc->appliedParams).literalCompressionMode;
    bVar15 = true;
    if ((zc->blockState).matchState.dictMatchState != (ZSTD_matchState_t *)0x0) {
      bVar15 = (zc->blockState).matchState.loadedDictEnd ==
               (zc->blockState).matchState.window.dictLimit;
    }
    if (!bVar15) {
      __assert_fail("ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3316,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    pBVar2 = (zc->blockState).matchState.window.base;
    uVar13 = (int)src - (int)pBVar2;
    if (0xfffffffe < (long)src - (long)pBVar2) {
      __assert_fail("istart - base < (ptrdiff_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x331c,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    if ((zc->blockState).matchState.nextToUpdate + 0x180 < uVar13) {
      if ((uVar13 - (zc->blockState).matchState.nextToUpdate) - 0x180 < 0xc1) {
        local_dc = (uVar13 - (zc->blockState).matchState.nextToUpdate) + -0x180;
      }
      else {
        local_dc = 0xc0;
      }
      (zc->blockState).matchState.nextToUpdate = uVar13 - local_dc;
    }
    dictMode_00 = ZSTD_matchState_dictMode(ms_00);
    for (ldmSeqStore.capacity._4_4_ = 0; ldmSeqStore.capacity._4_4_ < 3;
        ldmSeqStore.capacity._4_4_ = ldmSeqStore.capacity._4_4_ + 1) {
      ((zc->blockState).nextCBlock)->rep[ldmSeqStore.capacity._4_4_] =
           ((zc->blockState).prevCBlock)->rep[ldmSeqStore.capacity._4_4_];
    }
    if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
      if ((zc->appliedParams).ldmParams.enableLdm != 0) {
        __assert_fail("!zc->appliedParams.ldmParams.enableLdm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3329,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
      }
      sStack_90 = ZSTD_ldm_blockCompress
                            (&zc->externSeqStore,ms_00,&zc->seqStore,
                             ((zc->blockState).nextCBlock)->rep,src,srcSize);
      if ((zc->externSeqStore).size < (zc->externSeqStore).pos) {
        __assert_fail("zc->externSeqStore.pos <= zc->externSeqStore.size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3330,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
      }
    }
    else if ((zc->appliedParams).ldmParams.enableLdm == 0) {
      p_Var14 = ZSTD_selectBlockCompressor((zc->appliedParams).cParams.strategy,dictMode_00);
      sStack_90 = (*p_Var14)(ms_00,&zc->seqStore,((zc->blockState).nextCBlock)->rep,src,srcSize);
    }
    else {
      memset(&err_code,0,0x20);
      err_code = (size_t)zc->ldmSequences;
      ldmSeqStore.size = zc->maxNbLdmSequences;
      code = ZSTD_ldm_generateSequences
                       (&zc->ldmState,(rawSeqStore_t *)&err_code,&(zc->appliedParams).ldmParams,src,
                        srcSize);
      uVar13 = ERR_isError(code);
      if (uVar13 != 0) {
        return code;
      }
      sStack_90 = ZSTD_ldm_blockCompress
                            ((rawSeqStore_t *)&err_code,ms_00,&zc->seqStore,
                             ((zc->blockState).nextCBlock)->rep,src,srcSize);
      if (ldmSeqStore.seq != (rawSeq *)ldmSeqStore.pos) {
        __assert_fail("ldmSeqStore.pos == ldmSeqStore.size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3340,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
      }
    }
    ZSTD_storeLastLiterals(&zc->seqStore,(BYTE *)((long)src + (srcSize - sStack_90)),sStack_90);
    zc_local = (ZSTD_CCtx *)0x0;
  }
  return (size_t)zc_local;
}

Assistant:

static size_t ZSTD_buildSeqStore(ZSTD_CCtx* zc, const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_buildSeqStore (srcSize=%zu)", srcSize);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);
    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        return ZSTDbss_noCompress; /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    /* required for optimal parser to read stats from dictionary */
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;
    /* tell the optimal parser how we expect to compress literals */
    ms->opt.literalCompressionMode = zc->appliedParams.literalCompressionMode;
    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            FORWARD_IF_ERROR(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, dictMode);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }
    return ZSTDbss_compress;
}